

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

bool __thiscall indk::Event::doWaitTimed(Event *this,int T)

{
  cv_status cVar1;
  bool bVar2;
  byte local_51;
  undefined1 local_38 [8];
  unique_lock<std::mutex> oNotifierLock;
  bool bRet;
  bool bTimeout;
  milliseconds rTimeout;
  int T_local;
  Event *this_local;
  
  rTimeout.__r._4_4_ = T;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffe0,
             (int *)((long)&rTimeout.__r + 4));
  oNotifierLock._15_1_ = 0;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&this->m_oMutex);
  while( true ) {
    local_51 = 0;
    if ((this->m_bEvent & 1U) == 0) {
      local_51 = oNotifierLock._15_1_ ^ 0xff;
    }
    if ((local_51 & 1) == 0) break;
    cVar1 = std::condition_variable::wait_for<long,std::ratio<1l,1000l>>
                      (&this->m_oConditionVariable,(unique_lock<std::mutex> *)local_38,
                       (duration<long,_std::ratio<1L,_1000L>_> *)&stack0xffffffffffffffe0);
    oNotifierLock._15_1_ = cVar1 == timeout;
  }
  bVar2 = (bool)(this->m_bEvent & 1);
  this->m_bEvent = false;
  oNotifierLock._14_1_ = bVar2;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return bVar2;
}

Assistant:

bool indk::Event::doWaitTimed(int T) {
    auto rTimeout = std::chrono::milliseconds(T);
    bool bTimeout = false;
    bool bRet;
    std::unique_lock<std::mutex> oNotifierLock(m_oMutex);
    while (!m_bEvent && !bTimeout) {
        bTimeout = std::cv_status::timeout == m_oConditionVariable.wait_for(oNotifierLock, rTimeout);
    }
    bRet = m_bEvent;
    m_bEvent = false;
    return bRet;
}